

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O1

void baryonyx::convert<baryonyx::itm::minimize_tag>
               (raw_result<baryonyx::itm::minimize_tag> *source,solution *sol,int variables)

{
  ulong uVar1;
  
  sol->value = source->value;
  std::vector<signed_char,_std::allocator<signed_char>_>::resize(&sol->variables,(long)variables);
  if (variables != 0) {
    uVar1 = 0;
    do {
      (sol->variables).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar1] =
           ((source->x).super_bit_array_impl.m_data._M_t.
            super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
            super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
            super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl[uVar1 >> 6 & 0x3ffffff] >>
            (uVar1 & 0x3f) & 1) != 0;
      uVar1 = uVar1 + 1;
    } while ((uint)variables != uVar1);
  }
  return;
}

Assistant:

void
convert(const raw_result<Mode>& source, solution& sol, int variables)
{
    sol.value = source.value;
    sol.variables.resize(variables);

    for (int i = 0; i != variables; ++i)
        sol.variables[i] = static_cast<var_value>(source.x[i]);
}